

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_struct_reader
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_type *ptVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pptVar6;
  char *pcVar7;
  string padding;
  string local_90;
  string visibility;
  string local_50;
  
  pcVar7 = "public";
  if (this->gen_cocoa_ == false) {
    if (is_private) {
      pcVar7 = "fileprivate";
    }
    std::__cxx11::string::string((string *)&visibility,pcVar7,(allocator *)&padding);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,(string *)&visibility);
    poVar4 = std::operator<<(poVar4," static func read(from proto: TProtocol) throws -> ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
    block_open(this,out);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"_ = try proto.readStructBegin()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar6 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      bVar2 = field_is_optional(this,*pptVar6);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"var ");
      maybe_escape_identifier(&padding,this,&(*pptVar6)->name_);
      poVar4 = std::operator<<(poVar4,(string *)&padding);
      poVar4 = std::operator<<(poVar4,": ");
      type_name_abi_cxx11_(&local_90,this,(*pptVar6)->type_,bVar2,!bVar2);
      poVar4 = std::operator<<(poVar4,(string *)&local_90);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&padding);
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"fields: while true");
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"let (_, fieldType, fieldID) = try proto.readFieldBegin()");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"switch (fieldID, fieldType)");
    block_open(this,out);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"case (_, .stop):            break fields");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar6 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"case (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar6)->key_);
      poVar4 = std::operator<<(poVar4,", ");
      type_to_enum_abi_cxx11_(&padding,this,(*pptVar6)->type_,false);
      poVar4 = std::operator<<(poVar4,(string *)&padding);
      std::operator<<(poVar4,"):");
      std::__cxx11::string::~string((string *)&padding);
      std::__cxx11::string::string((string *)&padding,"",(allocator *)&local_90);
      ptVar5 = t_type::get_true_type((*pptVar6)->type_);
      iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[5])(ptVar5);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[10])(ptVar5);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xf])(ptVar5,"             ");
          if ((char)iVar3 == '\0') {
            iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0x10])(ptVar5,"             ");
            if ((char)iVar3 == '\0') {
              iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xb])(ptVar5,"             ");
              if ((char)iVar3 == '\0') {
                iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xc])(ptVar5,"           ");
                if ((char)iVar3 == '\0') {
                  iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xe])(ptVar5,"           ");
                  if ((char)iVar3 == '\0') goto LAB_002b4175;
                }
              }
            }
          }
        }
        std::__cxx11::string::assign((char *)&padding);
      }
      else if (*(int *)&ptVar5[1].super_t_doc._vptr_t_doc - 1U < 7) {
        std::__cxx11::string::assign((char *)&padding);
      }
LAB_002b4175:
      poVar4 = std::operator<<(out,(string *)&padding);
      maybe_escape_identifier(&local_90,this,&(*pptVar6)->name_);
      poVar4 = std::operator<<(poVar4,(string *)&local_90);
      poVar4 = std::operator<<(poVar4," = try ");
      type_name_abi_cxx11_(&local_50,this,(*pptVar6)->type_,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      poVar4 = std::operator<<(poVar4,".read(from: proto)");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&padding);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"case let (_, unknownType):  try proto.skip(type: unknownType)")
    ;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try proto.readFieldEnd()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try proto.readStructEnd()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    bVar2 = struct_has_required_fields(this,tstruct);
    if (bVar2) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"// Required fields");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar6 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
        bVar2 = field_is_optional(this,*pptVar6);
        if (!bVar2) {
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"try proto.validateValue(");
          maybe_escape_identifier(&padding,this,&(*pptVar6)->name_);
          poVar4 = std::operator<<(poVar4,(string *)&padding);
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,"named: \"");
          poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
          poVar4 = std::operator<<(poVar4,"\")");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&padding);
        }
      }
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"return ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_02,iVar3));
    std::operator<<(poVar4,"(");
    pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    while (pptVar6 !=
           (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      poVar4 = std::operator<<(out,(string *)&(*pptVar6)->name_);
      poVar4 = std::operator<<(poVar4,": ");
      maybe_escape_identifier(&padding,this,&(*pptVar6)->name_);
      std::operator<<(poVar4,(string *)&padding);
      std::__cxx11::string::~string((string *)&padding);
      pptVar6 = pptVar6 + 1;
      if (pptVar6 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::operator<<(out,", ");
      }
    }
  }
  else {
    if (is_private) {
      pcVar7 = "private";
    }
    std::__cxx11::string::string((string *)&visibility,pcVar7,(allocator *)&padding);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,(string *)&visibility);
    poVar4 = std::operator<<(poVar4,
                             " static func readValueFromProtocol(__proto: TProtocol) throws -> ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try __proto.readStructBegin()");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar6 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      bVar2 = field_is_optional(this,*pptVar6);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"var ");
      maybe_escape_identifier(&padding,this,&(*pptVar6)->name_);
      poVar4 = std::operator<<(poVar4,(string *)&padding);
      poVar4 = std::operator<<(poVar4," : ");
      type_name_abi_cxx11_(&local_90,this,(*pptVar6)->type_,bVar2,!bVar2);
      poVar4 = std::operator<<(poVar4,(string *)&local_90);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&padding);
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"fields: while true");
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"let (_, fieldType, fieldID) = try __proto.readFieldBegin()");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"switch (fieldID, fieldType)");
    block_open(this,out);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"case (_, .STOP):");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"break fields");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar6 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"case (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar6)->key_);
      poVar4 = std::operator<<(poVar4,", ");
      type_to_enum_abi_cxx11_(&padding,this,(*pptVar6)->type_,false);
      poVar4 = std::operator<<(poVar4,(string *)&padding);
      poVar4 = std::operator<<(poVar4,"):");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&padding);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar4 = t_generator::indent((t_generator *)this,out);
      maybe_escape_identifier(&padding,this,&(*pptVar6)->name_);
      poVar4 = std::operator<<(poVar4,(string *)&padding);
      poVar4 = std::operator<<(poVar4," = try __proto.readValue() as ");
      type_name_abi_cxx11_(&local_90,this,(*pptVar6)->type_,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_90);
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&padding);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"case let (_, unknownType):");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try __proto.skipType(unknownType)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try __proto.readFieldEnd()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try __proto.readStructEnd()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    bVar2 = struct_has_required_fields(this,tstruct);
    if (bVar2) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"// Required fields");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar6 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
        bVar2 = field_is_optional(this,*pptVar6);
        if (!bVar2) {
          poVar4 = t_generator::indent((t_generator *)this,out);
          poVar4 = std::operator<<(poVar4,"try __proto.validateValue(");
          poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::operator<<(poVar4,"named: \"");
          poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
          poVar4 = std::operator<<(poVar4,"\")");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        }
      }
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"return ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_01,iVar3));
    std::operator<<(poVar4,"(");
    pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    while (pptVar6 !=
           (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      poVar4 = std::operator<<(out,(string *)&(*pptVar6)->name_);
      poVar4 = std::operator<<(poVar4,": ");
      maybe_escape_identifier(&padding,this,&(*pptVar6)->name_);
      std::operator<<(poVar4,(string *)&padding);
      std::__cxx11::string::~string((string *)&padding);
      pptVar6 = pptVar6 + 1;
      if (pptVar6 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::operator<<(out,", ");
      }
    }
  }
  std::__cxx11::string::~string((string *)&visibility);
  poVar4 = std::operator<<(out,")");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_reader(ostream& out,
                                                     t_struct* tstruct,
                                                     bool is_private) {

  if (!gen_cocoa_) {
    /** Swift 3 case */
    string visibility = is_private ? "fileprivate" : "public";

    indent(out) << visibility << " static func read(from proto: TProtocol) throws -> "
               << tstruct->get_name();

    block_open(out);
    indent(out) << "_ = try proto.readStructBegin()" << endl;

    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      bool optional = field_is_optional(*f_iter);
      indent(out) << "var " << maybe_escape_identifier((*f_iter)->get_name()) << ": "
                  << type_name((*f_iter)->get_type(), optional, !optional) << endl;
    }

    out << endl;

    // Loop over reading in fields
    indent(out) << "fields: while true";
    block_open(out);
    out << endl;

    indent(out) << "let (_, fieldType, fieldID) = try proto.readFieldBegin()" << endl << endl;
    indent(out) << "switch (fieldID, fieldType)";
    block_open(out);
    indent(out) << "case (_, .stop):            break fields" << endl;


    // Generate deserialization code for known cases
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      indent(out) << "case (" << (*f_iter)->get_key() << ", " << type_to_enum((*f_iter)->get_type()) << "):";
      string padding = "";

      t_type* type = get_true_type((*f_iter)->get_type());
      if (type->is_base_type()) {
        t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
        switch (tbase) {
          case t_base_type::TYPE_STRING:
          case t_base_type::TYPE_DOUBLE:
            padding = "           ";
          break;

          case t_base_type::TYPE_BOOL:
          case t_base_type::TYPE_I8:
            padding = "            ";
          break;
          case t_base_type::TYPE_I16:
          case t_base_type::TYPE_I32:
          case t_base_type::TYPE_I64:
            padding = "             ";
          break;
          default: break;
        }
      } else if (type->is_enum() || type->is_set() || type->is_map()) {
        padding = "             ";
      } else if (type->is_struct() || type->is_xception()) {
        padding = "           ";
      } else if (type->is_list()) {
        padding = "            ";
      }

      out << padding << maybe_escape_identifier((*f_iter)->get_name()) << " = try "
          << type_name((*f_iter)->get_type(), false, false) << ".read(from: proto)" << endl;
    }

    indent(out) << "case let (_, unknownType):  try proto.skip(type: unknownType)" << endl;
    block_close(out);
    out << endl;

    // Read field end marker
    indent(out) << "try proto.readFieldEnd()" << endl;
    block_close(out);
    out << endl;
    indent(out) << "try proto.readStructEnd()" << endl;

    if (struct_has_required_fields(tstruct)) {
      // performs various checks (e.g. check that all required fields are set)
      indent(out) << "// Required fields" << endl;

      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if (field_is_optional(*f_iter)) {
          continue;
        }
        indent(out) << "try proto.validateValue(" << maybe_escape_identifier((*f_iter)->get_name()) << ", "
                    << "named: \"" << (*f_iter)->get_name() << "\")" << endl;
      }
    }

    out << endl;

    indent(out) << "return " << tstruct->get_name() << "(";
    for (f_iter = fields.begin(); f_iter != fields.end();) {
      out << (*f_iter)->get_name() << ": " << maybe_escape_identifier((*f_iter)->get_name());
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }

  } else {
    /** Legacy Swif2/Cocoa case */
    string visibility = is_private ? "private" : "public";

    indent(out) << visibility << " static func readValueFromProtocol(__proto: TProtocol) throws -> "
                << tstruct->get_name();

    block_open(out);
    out << endl;
    indent(out) << "try __proto.readStructBegin()" << endl << endl;

    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      bool optional = field_is_optional(*f_iter);
      indent(out) << "var " << maybe_escape_identifier((*f_iter)->get_name()) << " : "
                  << type_name((*f_iter)->get_type(), optional, !optional) << endl;
    }

    out << endl;

    // Loop over reading in fields
    indent(out) << "fields: while true";
    block_open(out);
    out << endl;

    indent(out) << "let (_, fieldType, fieldID) = try __proto.readFieldBegin()" << endl << endl;
    indent(out) << "switch (fieldID, fieldType)";

    block_open(out);

    indent(out) << "case (_, .STOP):" << endl;
    indent_up();
    indent(out) << "break fields" << endl << endl;
    indent_down();

    // Generate deserialization code for known cases
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {

      indent(out) << "case (" << (*f_iter)->get_key() << ", " << type_to_enum((*f_iter)->get_type()) << "):" << endl;
      indent_up();
      indent(out) << maybe_escape_identifier((*f_iter)->get_name()) << " = try __proto.readValue() as "
                  << type_name((*f_iter)->get_type()) << endl << endl;
      indent_down();

    }

    indent(out) << "case let (_, unknownType):" << endl;
    indent_up();
    indent(out) << "try __proto.skipType(unknownType)" << endl;
    indent_down();
    block_close(out);
    out << endl;

    // Read field end marker
    indent(out) << "try __proto.readFieldEnd()" << endl;

    block_close(out);
    out << endl;
    indent(out) << "try __proto.readStructEnd()" << endl;
    out << endl;

    if (struct_has_required_fields(tstruct)) {
      // performs various checks (e.g. check that all required fields are set)
      indent(out) << "// Required fields" << endl;

      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if (field_is_optional(*f_iter)) {
          continue;
        }
        indent(out) << "try __proto.validateValue(" << (*f_iter)->get_name() << ", "
                    << "named: \"" << (*f_iter)->get_name() << "\")" << endl;
      }
    }

    out << endl;

    indent(out) << "return " << tstruct->get_name() << "(";
    for (f_iter = fields.begin(); f_iter != fields.end();) {
      out << (*f_iter)->get_name() << ": " << maybe_escape_identifier((*f_iter)->get_name());
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }
  }
  out << ")" << endl;

  block_close(out);

  out << endl;
}